

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

void __thiscall llama_vocab::impl::init_tokenizer(impl *this,llama_vocab_type type)

{
  unique_ptr<llm_tokenizer_bpe,_std::default_delete<llm_tokenizer_bpe>_> *this_00;
  uint in_ESI;
  unique_ptr<llm_tokenizer_bpe,_std::default_delete<llm_tokenizer_bpe>_> *in_stack_ffffffffffffffc8;
  unique_ptr<llm_tokenizer,_std::default_delete<llm_tokenizer>_> *in_stack_ffffffffffffffd0;
  llama_vocab *in_stack_ffffffffffffffd8;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  llama_vocab *in_stack_ffffffffffffffe8;
  
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: initializing tokenizer for type %d\n",
                     "init_tokenizer",(ulong)in_ESI);
  this_00 = (unique_ptr<llm_tokenizer_bpe,_std::default_delete<llm_tokenizer_bpe>_> *)
            (ulong)(in_ESI - 1);
  switch(this_00) {
  case (unique_ptr<llm_tokenizer_bpe,_std::default_delete<llm_tokenizer_bpe>_> *)0x0:
    ::std::make_unique<llm_tokenizer_spm,llama_vocab_const&>(in_stack_ffffffffffffffd8);
    ::std::unique_ptr<llm_tokenizer,std::default_delete<llm_tokenizer>>::operator=
              (in_stack_ffffffffffffffd0,
               (unique_ptr<llm_tokenizer_spm,_std::default_delete<llm_tokenizer_spm>_> *)
               in_stack_ffffffffffffffc8);
    std::unique_ptr<llm_tokenizer_spm,_std::default_delete<llm_tokenizer_spm>_>::~unique_ptr
              ((unique_ptr<llm_tokenizer_spm,_std::default_delete<llm_tokenizer_spm>_> *)this_00);
    break;
  case (unique_ptr<llm_tokenizer_bpe,_std::default_delete<llm_tokenizer_bpe>_> *)0x1:
    ::std::make_unique<llm_tokenizer_bpe,llama_vocab_const&>(in_stack_ffffffffffffffd8);
    ::std::unique_ptr<llm_tokenizer,std::default_delete<llm_tokenizer>>::operator=
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::unique_ptr<llm_tokenizer_bpe,_std::default_delete<llm_tokenizer_bpe>_>::~unique_ptr
              (this_00);
    break;
  case (unique_ptr<llm_tokenizer_bpe,_std::default_delete<llm_tokenizer_bpe>_> *)0x2:
    ::std::make_unique<llm_tokenizer_wpm,llama_vocab_const&>(in_stack_ffffffffffffffd8);
    ::std::unique_ptr<llm_tokenizer,std::default_delete<llm_tokenizer>>::operator=
              (in_stack_ffffffffffffffd0,
               (unique_ptr<llm_tokenizer_wpm,_std::default_delete<llm_tokenizer_wpm>_> *)
               in_stack_ffffffffffffffc8);
    std::unique_ptr<llm_tokenizer_wpm,_std::default_delete<llm_tokenizer_wpm>_>::~unique_ptr
              ((unique_ptr<llm_tokenizer_wpm,_std::default_delete<llm_tokenizer_wpm>_> *)this_00);
    break;
  case (unique_ptr<llm_tokenizer_bpe,_std::default_delete<llm_tokenizer_bpe>_> *)0x3:
    ::std::make_unique<llm_tokenizer_ugm,llama_vocab_const&,std::vector<char,std::allocator<char>>&>
              (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    ::std::unique_ptr<llm_tokenizer,std::default_delete<llm_tokenizer>>::operator=
              (in_stack_ffffffffffffffd0,
               (unique_ptr<llm_tokenizer_ugm,_std::default_delete<llm_tokenizer_ugm>_> *)
               in_stack_ffffffffffffffc8);
    std::unique_ptr<llm_tokenizer_ugm,_std::default_delete<llm_tokenizer_ugm>_>::~unique_ptr
              ((unique_ptr<llm_tokenizer_ugm,_std::default_delete<llm_tokenizer_ugm>_> *)this_00);
    break;
  case (unique_ptr<llm_tokenizer_bpe,_std::default_delete<llm_tokenizer_bpe>_> *)0x4:
    ::std::make_unique<llm_tokenizer_rwkv,llama_vocab_const&>(in_stack_ffffffffffffffd8);
    ::std::unique_ptr<llm_tokenizer,std::default_delete<llm_tokenizer>>::operator=
              (in_stack_ffffffffffffffd0,
               (unique_ptr<llm_tokenizer_rwkv,_std::default_delete<llm_tokenizer_rwkv>_> *)
               in_stack_ffffffffffffffc8);
    std::unique_ptr<llm_tokenizer_rwkv,_std::default_delete<llm_tokenizer_rwkv>_>::~unique_ptr
              ((unique_ptr<llm_tokenizer_rwkv,_std::default_delete<llm_tokenizer_rwkv>_> *)this_00);
    break;
  default:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
               ,0x88f,"unsupported vocab type");
  }
  return;
}

Assistant:

void llama_vocab::impl::init_tokenizer(enum llama_vocab_type type) {
    LLAMA_LOG_DEBUG("%s: initializing tokenizer for type %d\n", __func__, type);

    switch (type) {
        case LLAMA_VOCAB_TYPE_SPM:
            tokenizer = std::make_unique<llm_tokenizer_spm>(vocab);
            break;
        case LLAMA_VOCAB_TYPE_BPE:
            tokenizer = std::make_unique<llm_tokenizer_bpe>(vocab);
            break;
        case LLAMA_VOCAB_TYPE_WPM:
            tokenizer = std::make_unique<llm_tokenizer_wpm>(vocab);
            break;
        case LLAMA_VOCAB_TYPE_UGM:
            tokenizer = std::make_unique<llm_tokenizer_ugm>(vocab, precompiled_charsmap);
            break;
        case LLAMA_VOCAB_TYPE_RWKV:
            tokenizer = std::make_unique<llm_tokenizer_rwkv>(vocab);
            break;
        default:
            GGML_ABORT("unsupported vocab type");
    }
}